

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_fdivr_STN_ST0_x86_64(CPUX86State *env,int st_index)

{
  uint uVar1;
  ulong uVar2;
  floatx80 fVar3;
  floatx80 a;
  
  uVar1 = env->fpstt;
  uVar2 = (ulong)((st_index + uVar1 & 7) << 4);
  fVar3._8_4_ = *(undefined4 *)((long)env->fpregs + uVar2 + 8);
  fVar3.low = *(undefined8 *)((long)env->fpregs + uVar2);
  fVar3._12_4_ = 0;
  a._8_4_ = *(undefined4 *)((long)env->fpregs + (ulong)uVar1 * 0x10 + 8);
  a.low = env->fpregs[uVar1].d.low;
  a._12_4_ = 0;
  fVar3 = helper_fdiv(env,a,fVar3);
  *(uint64_t *)((long)env->fpregs + uVar2) = fVar3.low;
  *(uint16_t *)((long)env->fpregs + uVar2 + 8) = fVar3.high;
  return;
}

Assistant:

void helper_fdivr_STN_ST0(CPUX86State *env, int st_index)
{
    floatx80 *p;

    p = &ST(st_index);
    *p = helper_fdiv(env, ST0, *p);
}